

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dynamic_groups.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  int iVar2;
  tommy_node *ptVar3;
  long in_FS_OFFSET;
  uint local_4c0;
  int local_4bc;
  int i_1;
  int i;
  rtr_mgr_group_node *group_node2;
  rtr_mgr_group_node *group_node;
  tommy_node *node;
  int sleep_counter;
  int retval;
  rtr_mgr_group group5;
  rtr_socket rtr_tcp5;
  tr_socket tr_tcp5;
  rtr_mgr_group group4;
  rtr_socket rtr_tcp4;
  tr_socket tr_tcp4;
  rtr_mgr_group group3;
  rtr_socket rtr_tcp3;
  tr_socket tr_tcp3;
  rtr_mgr_config *conf;
  rtr_mgr_group group2;
  rtr_socket rtr_tcp2;
  tr_socket tr_tcp2;
  rtr_socket rtr_tcp;
  tr_tcp_config tcp_config;
  tr_socket tr_tcp;
  undefined1 auStack_58 [3];
  char tcp_port [5];
  rtr_mgr_group groups [1];
  undefined1 local_38 [8];
  char tcp_host [33];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  sleep_counter = 0;
  memcpy(local_38,"rpki-cache.netd.cs.tu-dresden.de",0x21);
  tr_tcp.ident_fp._3_4_ = 0x33323333;
  tr_tcp.ident_fp._7_1_ = 0;
  rtr_tcp._120_8_ = local_38;
  tcp_config.host = (char *)((long)&tr_tcp.ident_fp + 3);
  tcp_config.port = (char *)0x0;
  tcp_config.bindaddr = (char *)0x0;
  tcp_config.data = (void *)0x0;
  tcp_config.new_socket._0_4_ = 0;
  tr_tcp_init((tr_tcp_config *)&rtr_tcp.is_resetting,(tr_socket *)&tcp_config.connect_timeout);
  tr_tcp2.ident_fp = (tr_ident_fp)&tcp_config.connect_timeout;
  _auStack_58 = (rtr_socket **)malloc(8);
  *_auStack_58 = (rtr_socket *)&tr_tcp2.ident_fp;
  tr_tcp_init((tr_tcp_config *)&rtr_tcp.is_resetting,(tr_socket *)&rtr_tcp2.is_resetting);
  group2._16_8_ = &rtr_tcp2.is_resetting;
  conf = (rtr_mgr_config *)malloc(8);
  group2.sockets._0_4_ = 1;
  conf->groups = (tommy_list_wrapper *)&group2.status;
  group2.sockets._4_1_ = 2;
  rtr_mgr_init((rtr_mgr_config **)&tr_tcp3.ident_fp,(rtr_mgr_group *)auStack_58,1,
               connection_status_callback,(void *)0x0);
  rtr_mgr_add_roa_support((rtr_mgr_config *)tr_tcp3.ident_fp,(pfx_update_fp)0x0);
  rtr_mgr_add_aspa_support((rtr_mgr_config *)tr_tcp3.ident_fp,(aspa_update_fp)0x0);
  rtr_mgr_add_spki_support((rtr_mgr_config *)tr_tcp3.ident_fp,(spki_update_fp)0x0);
  rtr_mgr_setup_sockets
            ((rtr_mgr_config *)tr_tcp3.ident_fp,(rtr_mgr_group *)auStack_58,1,0x32,600,600);
  rtr_mgr_start((rtr_mgr_config *)tr_tcp3.ident_fp);
  node._4_4_ = 0;
  do {
    _Var1 = rtr_mgr_conf_in_sync((rtr_mgr_config *)tr_tcp3.ident_fp);
    if (((_Var1 ^ 0xffU) & 1) == 0) {
      if (*(int *)(tr_tcp3.ident_fp + 8) != 1) {
        __assert_fail("conf->len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                      ,0x54,"int main(void)");
      }
      iVar2 = rtr_mgr_add_group((rtr_mgr_config *)tr_tcp3.ident_fp,(rtr_mgr_group *)&conf);
      if (iVar2 != 0) {
        __assert_fail("retval == RTR_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                      ,0x57,"int main(void)");
      }
      iVar2 = rtr_mgr_add_group((rtr_mgr_config *)tr_tcp3.ident_fp,(rtr_mgr_group *)&conf);
      if (iVar2 != -2) {
        __assert_fail("retval == RTR_INVALID_PARAM",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                      ,0x5c,"int main(void)");
      }
      ptVar3 = tommy_list_head(*(tommy_list **)tr_tcp3.ident_fp);
      if (*(char *)(*(long *)((long)ptVar3->data + 0x20) + 0xc) != '\x01') {
        __assert_fail("group_node->group->preference == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                      ,0x62,"int main(void)");
      }
      if (*(char *)(*(long *)((long)ptVar3->next->data + 0x20) + 0xc) != '\x02') {
        __assert_fail("group_node2->group->preference == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                      ,99,"int main(void)");
      }
      if (*(int *)(tr_tcp3.ident_fp + 8) != 2) {
        __assert_fail("conf->len == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                      ,100,"int main(void)");
      }
      rtr_mgr_remove_group((rtr_mgr_config *)tr_tcp3.ident_fp,1);
      ptVar3 = tommy_list_head(*(tommy_list **)tr_tcp3.ident_fp);
      if (*(char *)(*(long *)((long)ptVar3->data + 0x20) + 0xc) != '\x02') {
        __assert_fail("group_node->group->preference == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                      ,0x6a,"int main(void)");
      }
      if (*(int *)(tr_tcp3.ident_fp + 8) != 1) {
        __assert_fail("conf->len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                      ,0x6b,"int main(void)");
      }
      tr_tcp_init((tr_tcp_config *)&rtr_tcp.is_resetting,(tr_socket *)&rtr_tcp3.is_resetting);
      group3._16_8_ = &rtr_tcp3.is_resetting;
      tr_tcp4.ident_fp = (tr_ident_fp)malloc(8);
      group3.sockets._0_4_ = 1;
      *(rtr_mgr_status **)tr_tcp4.ident_fp = &group3.status;
      group3.sockets._4_1_ = 3;
      tr_tcp_init((tr_tcp_config *)&rtr_tcp.is_resetting,(tr_socket *)&rtr_tcp4.is_resetting);
      group4._16_8_ = &rtr_tcp4.is_resetting;
      tr_tcp5.ident_fp = (tr_ident_fp)malloc(8);
      group4.sockets._0_4_ = 1;
      *(rtr_mgr_status **)tr_tcp5.ident_fp = &group4.status;
      group4.sockets._4_1_ = 4;
      rtr_mgr_add_group((rtr_mgr_config *)tr_tcp3.ident_fp,(rtr_mgr_group *)&tr_tcp5.ident_fp);
      rtr_mgr_remove_group((rtr_mgr_config *)tr_tcp3.ident_fp,2);
      rtr_mgr_add_group((rtr_mgr_config *)tr_tcp3.ident_fp,(rtr_mgr_group *)&tr_tcp4.ident_fp);
      ptVar3 = tommy_list_head(*(tommy_list **)tr_tcp3.ident_fp);
      if (*(char *)(*(long *)((long)ptVar3->data + 0x20) + 0xc) != '\x03') {
        __assert_fail("group_node->group->preference == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                      ,0x8e,"int main(void)");
      }
      iVar2 = rtr_mgr_remove_group((rtr_mgr_config *)tr_tcp3.ident_fp,10);
      if (iVar2 != -1) {
        __assert_fail("retval == RTR_ERROR",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                      ,0x92,"int main(void)");
      }
      tr_tcp_init((tr_tcp_config *)&rtr_tcp.is_resetting,(tr_socket *)&rtr_tcp5.is_resetting);
      group5._16_8_ = &rtr_tcp5.is_resetting;
      _retval = (rtr_socket **)malloc(8);
      group5.sockets._0_4_ = 1;
      *_retval = (rtr_socket *)&group5.status;
      group5.sockets._4_1_ = '\x05';
      for (local_4bc = 0; local_4bc < 100; local_4bc = local_4bc + 1) {
        iVar2 = rtr_mgr_add_group((rtr_mgr_config *)tr_tcp3.ident_fp,(rtr_mgr_group *)&retval);
        group5.sockets._4_1_ = group5.sockets._4_1_ + '\x01';
        if (iVar2 != 0) {
          __assert_fail("retval == RTR_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                        ,0xa3,"int main(void)");
        }
      }
      for (local_4c0 = 0x68; 4 < (int)local_4c0; local_4c0 = local_4c0 - 1) {
        iVar2 = rtr_mgr_remove_group((rtr_mgr_config *)tr_tcp3.ident_fp,local_4c0);
        if (iVar2 != 0) {
          __assert_fail("retval == RTR_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                        ,0xa9,"int main(void)");
        }
      }
      rtr_mgr_remove_group((rtr_mgr_config *)tr_tcp3.ident_fp,4);
      iVar2 = rtr_mgr_remove_group((rtr_mgr_config *)tr_tcp3.ident_fp,3);
      if (iVar2 != -1) {
        __assert_fail("retval == RTR_ERROR",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                      ,0xb0,"int main(void)");
      }
      rtr_mgr_stop((rtr_mgr_config *)tr_tcp3.ident_fp);
      rtr_mgr_free((rtr_mgr_config *)tr_tcp3.ident_fp);
      free(_auStack_58);
      free(conf);
      free(tr_tcp4.ident_fp);
      free(tr_tcp5.ident_fp);
      free(_retval);
LAB_00105ca2:
      if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
        return sleep_counter;
      }
      __stack_chk_fail();
    }
    node._4_4_ = node._4_4_ + 1;
    if ((connection_status == RTR_MGR_ERROR) || (0x50 < node._4_4_)) {
      sleep_counter = 1;
      goto LAB_00105ca2;
    }
    sleep(1);
  } while( true );
}

Assistant:

int main(void)
{
	int retval = 0;
	char tcp_host[] = "rpki-cache.netd.cs.tu-dresden.de";
	char tcp_port[] = "3323";

	/* create a TCP transport socket */
	struct tr_socket tr_tcp;
	struct tr_tcp_config tcp_config = {
		tcp_host, //IP
		tcp_port, //Port
		NULL, //Source address
		NULL, //data
		NULL, //new_socket()
		0, // connect timeout
	};
	struct rtr_socket rtr_tcp;
	struct rtr_mgr_group groups[1];

	/* init a TCP transport and create rtr socket */
	tr_tcp_init(&tcp_config, &tr_tcp);
	rtr_tcp.tr_socket = &tr_tcp;

	/* create a rtr_mr_group array with 1 element */
	groups[0].sockets = malloc(sizeof(struct rtr_socket *));
	groups[0].sockets_len = 1;
	groups[0].sockets[0] = &rtr_tcp;
	groups[0].preference = 1;

	struct tr_socket tr_tcp2;
	struct rtr_socket rtr_tcp2;
	struct rtr_mgr_group group2;

	tr_tcp_init(&tcp_config, &tr_tcp2);
	rtr_tcp2.tr_socket = &tr_tcp2;
	group2.sockets = malloc(sizeof(struct rtr_socket *));
	group2.sockets_len = 1;
	group2.sockets[0] = &rtr_tcp2;
	group2.preference = 2;

	struct rtr_mgr_config *conf;

	rtr_mgr_init(&conf, groups, 1, &connection_status_callback, NULL);
	rtr_mgr_add_roa_support(conf, NULL);
	rtr_mgr_add_aspa_support(conf, NULL);
	rtr_mgr_add_spki_support(conf, NULL);
	rtr_mgr_setup_sockets(conf, groups, 1, 50, 600, 600);

	//start the connection manager
	rtr_mgr_start(conf);

	int sleep_counter = 0;
	// wait 20 sec till at least one group is fully synchronized with the server
	// otherwise EXIT_FAILURE.
	while (!rtr_mgr_conf_in_sync(conf)) {
		sleep_counter++;
		if (connection_status == RTR_MGR_ERROR || sleep_counter > connection_timeout)
			return EXIT_FAILURE;

		sleep(1);
	}

	assert(conf->len == 1);

	retval = rtr_mgr_add_group(conf, &group2);
	assert(retval == RTR_SUCCESS);

	//checking behavior in case the group preference already exists
	//by adding the same group twice.
	retval = rtr_mgr_add_group(conf, &group2);
	assert(retval == RTR_INVALID_PARAM);

	tommy_node *node = tommy_list_head(&conf->groups->list);
	struct rtr_mgr_group_node *group_node = node->data;
	struct rtr_mgr_group_node *group_node2 = node->next->data;

	assert(group_node->group->preference == 1);
	assert(group_node2->group->preference == 2);
	assert(conf->len == 2);

	rtr_mgr_remove_group(conf, 1);

	node = tommy_list_head(&conf->groups->list);
	group_node = node->data;
	assert(group_node->group->preference == 2);
	assert(conf->len == 1);

	struct tr_socket tr_tcp3;
	struct rtr_socket rtr_tcp3;
	struct rtr_mgr_group group3;

	tr_tcp_init(&tcp_config, &tr_tcp3);
	rtr_tcp3.tr_socket = &tr_tcp3;
	group3.sockets = malloc(sizeof(struct rtr_socket *));
	group3.sockets_len = 1;
	group3.sockets[0] = &rtr_tcp3;
	group3.preference = 3;

	struct tr_socket tr_tcp4;
	struct rtr_socket rtr_tcp4;
	struct rtr_mgr_group group4;

	tr_tcp_init(&tcp_config, &tr_tcp4);
	rtr_tcp4.tr_socket = &tr_tcp4;
	group4.sockets = malloc(sizeof(struct rtr_socket *));
	group4.sockets_len = 1;
	group4.sockets[0] = &rtr_tcp4;
	group4.preference = 4;

	rtr_mgr_add_group(conf, &group4);

	// remove group 2 so group 4 becomes the active group.
	rtr_mgr_remove_group(conf, 2);

	// add group 3 which has a higher preference than group 4
	// and check whether it will be set as the active group.
	rtr_mgr_add_group(conf, &group3);

	node = tommy_list_head(&conf->groups->list);
	group_node = node->data;
	assert(group_node->group->preference == 3);

	//try to remove non-existent group
	retval = rtr_mgr_remove_group(conf, 10);
	assert(retval == RTR_ERROR);

	struct tr_socket tr_tcp5;
	struct rtr_socket rtr_tcp5;
	struct rtr_mgr_group group5;

	tr_tcp_init(&tcp_config, &tr_tcp5);
	rtr_tcp5.tr_socket = &tr_tcp5;
	group5.sockets = malloc(sizeof(struct rtr_socket *));
	group5.sockets_len = 1;
	group5.sockets[0] = &rtr_tcp5;
	group5.preference = 5;

	//add 100 groups
	for (int i = 0; i < 100; i++) {
		retval = rtr_mgr_add_group(conf, &group5);
		group5.preference++;
		assert(retval == RTR_SUCCESS);
	}

	//remove 100 groups
	for (int i = 104; i >= 5; i--) {
		retval = rtr_mgr_remove_group(conf, i);
		assert(retval == RTR_SUCCESS);
	}

	rtr_mgr_remove_group(conf, 4);

	//try to remove last remainig group.
	retval = rtr_mgr_remove_group(conf, 3);
	assert(retval == RTR_ERROR);
	rtr_mgr_stop(conf);
	rtr_mgr_free(conf);
	free(groups[0].sockets);
	free(group2.sockets);
	free(group3.sockets);
	free(group4.sockets);
	free(group5.sockets);
}